

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)58,_(unsigned_short)8>::Unpack
               (uint32_t **in,uint64_t *out)

{
  ushort uVar1;
  uint32_t *puVar2;
  ulong uVar3;
  
  puVar2 = *in;
  uVar1 = *(ushort *)((long)puVar2 + 2);
  out[8] = (ulong)uVar1;
  *in = puVar2 + 1;
  uVar3 = (ulong)CONCAT42(puVar2[1],uVar1);
  out[8] = uVar3;
  *in = puVar2 + 2;
  out[8] = (ulong)(puVar2[2] & 0x3ff) << 0x30 | uVar3;
  Unroller<(unsigned_short)58,_(unsigned_short)9>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}